

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

void duckdb::AggregateFunction::
     StateInitialize<duckdb::HistogramAggState<int,std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>,(duckdb::AggregateDestructorType)0>
               (AggregateFunction *param_1,data_ptr_t state)

{
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  *in_RSI;
  
  HistogramFunction<duckdb::DefaultMapType<std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
  ::
  Initialize<duckdb::HistogramAggState<int,std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
            (in_RSI);
  return;
}

Assistant:

static void StateInitialize(const AggregateFunction &, data_ptr_t state) {
		// FIXME: we should remove the "destructor_type" option in the future
#if !defined(__GNUC__) || (__GNUC__ >= 5)
		static_assert(std::is_trivially_move_constructible<STATE>::value ||
		                  destructor_type == AggregateDestructorType::LEGACY,
		              "Aggregate state must be trivially move constructible");
#endif
		OP::Initialize(*reinterpret_cast<STATE *>(state));
	}